

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocation __thiscall
soul::SimpleTokeniser::findNext(SimpleTokeniser *this,CodeLocation *start,TokenType target)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  AbortCompilationException *anon_var_0;
  undefined1 local_98 [8];
  SimpleTokeniser tokeniser;
  CodeLocation *start_local;
  TokenType target_local;
  
  tokeniser.super_SOULTokeniser.literalType.text = (char *)start;
  SimpleTokeniser((SimpleTokeniser *)local_98,start,true);
  do {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       *)local_98,(TokenType)"$eof");
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = false;
LAB_003d1481:
      ~SimpleTokeniser((SimpleTokeniser *)local_98);
      UVar2.data = extraout_RDX_00;
      if (!bVar1) {
        memset(this,0,0x10);
        CodeLocation::CodeLocation((CodeLocation *)this);
        UVar2.data = extraout_RDX;
      }
      CVar3.location.data = UVar2.data;
      CVar3.sourceCode.object = (SourceCodeText *)this;
      return CVar3;
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       *)local_98,target);
    if (bVar1) {
      CodeLocation::CodeLocation
                ((CodeLocation *)this,
                 (CodeLocation *)&tokeniser.super_SOULTokeniser.startLocation.location);
      bVar1 = true;
      goto LAB_003d1481;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            *)local_98);
  } while( true );
}

Assistant:

static CodeLocation findNext (CodeLocation start, TokenType target)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);

            while (! tokeniser.matches (Token::eof))
            {
                if (tokeniser.matches (target))
                    return tokeniser.location;

                tokeniser.skip();
            }
        }
        catch (const AbortCompilationException&) {}

        return {};
    }